

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O2

ostream * __thiscall OpenMD::DumpWriter::createOStream(DumpWriter *this,string *filename)

{
  ostream *this_00;
  ostream *poVar1;
  string asStack_38 [32];
  
  this_00 = (ostream *)operator_new(0x200);
  std::ofstream::ofstream(this_00,(filename->_M_dataplus)._M_p,_S_out);
  poVar1 = std::operator<<(this_00,"<OpenMD version=2>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this_00,"  <MetaData>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string(asStack_38,(string *)&this->info_->rawMetaData_);
  std::operator<<(this_00,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  poVar1 = std::operator<<(this_00,"  </MetaData>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return this_00;
}

Assistant:

std::ostream* DumpWriter::createOStream(const std::string& filename) {
    std::ostream* newOStream;
#ifdef HAVE_ZLIB
    if (needCompression_) {
      newOStream = new ogzstream(filename.c_str());
    } else {
      newOStream = new std::ofstream(filename.c_str());
    }
#else
    newOStream = new std::ofstream(filename.c_str());
#endif
    // write out MetaData first
    (*newOStream) << "<OpenMD version=2>" << std::endl;
    (*newOStream) << "  <MetaData>" << std::endl;
    (*newOStream) << info_->getRawMetaData();
    (*newOStream) << "  </MetaData>" << std::endl;
    return newOStream;
  }